

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_iterator.cpp
# Opt level: O3

void __thiscall
duckdb::BoundNodeVisitor::VisitBoundQueryNode(BoundNodeVisitor *this,BoundQueryNode *node)

{
  vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_true>
  *this_00;
  ResultModifierType RVar1;
  pointer puVar2;
  pointer pBVar3;
  _Hash_node_base *p_Var4;
  BoundSelectNode *pBVar5;
  BoundRecursiveCTENode *pBVar6;
  BoundCTENode *pBVar7;
  type pBVar8;
  BoundSetOperationNode *pBVar9;
  reference pvVar10;
  pointer pBVar11;
  BoundDistinctModifier *pBVar12;
  BoundOrderModifier *pBVar13;
  BoundLimitModifier *pBVar14;
  BoundLimitModifier *pBVar15;
  type pBVar16;
  NotImplementedException *this_01;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar17;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr;
  size_type __n;
  _Hash_node_base *p_Var18;
  pointer puVar19;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_5;
  pointer pBVar20;
  _Hash_node_base *p_Var21;
  unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true> *this_02;
  string local_50;
  
  switch(node->type) {
  case SELECT_NODE:
    pBVar5 = BoundQueryNode::Cast<duckdb::BoundSelectNode>(node);
    puVar2 = (pBVar5->select_list).
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar19 = (pBVar5->select_list).
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar19 != puVar2;
        puVar19 = puVar19 + 1) {
      (*this->_vptr_BoundNodeVisitor[4])(this,puVar19);
    }
    if ((pBVar5->where_clause).
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
      (*this->_vptr_BoundNodeVisitor[4])(this,&pBVar5->where_clause);
    }
    puVar2 = (pBVar5->groups).group_expressions.
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar19 = (pBVar5->groups).group_expressions.
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar19 != puVar2;
        puVar19 = puVar19 + 1) {
      (*this->_vptr_BoundNodeVisitor[4])(this,puVar19);
    }
    if ((pBVar5->having).
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
      (*this->_vptr_BoundNodeVisitor[4])(this,&pBVar5->having);
    }
    puVar2 = (pBVar5->aggregates).
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar19 = (pBVar5->aggregates).
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar19 != puVar2;
        puVar19 = puVar19 + 1) {
      (*this->_vptr_BoundNodeVisitor[4])(this,puVar19);
    }
    for (p_Var21 = (pBVar5->unnests)._M_h._M_before_begin._M_nxt; p_Var21 != (_Hash_node_base *)0x0;
        p_Var21 = p_Var21->_M_nxt) {
      p_Var4 = p_Var21[4]._M_nxt;
      for (p_Var18 = p_Var21[3]._M_nxt; p_Var18 != p_Var4; p_Var18 = p_Var18 + 1) {
        (*this->_vptr_BoundNodeVisitor[4])(this,p_Var18);
      }
    }
    puVar2 = (pBVar5->windows).
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar19 = (pBVar5->windows).
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar19 != puVar2;
        puVar19 = puVar19 + 1) {
      (*this->_vptr_BoundNodeVisitor[4])(this,puVar19);
    }
    if ((pBVar5->from_table).
        super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
        super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>
        .super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl != (BoundTableRef *)0x0)
    {
      pBVar16 = unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                ::operator*(&pBVar5->from_table);
      (*this->_vptr_BoundNodeVisitor[3])(this,pBVar16);
    }
    goto LAB_00e1134e;
  case SET_OPERATION_NODE:
    pBVar9 = BoundQueryNode::Cast<duckdb::BoundSetOperationNode>(node);
    pBVar8 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
             operator*(&pBVar9->left);
    (*this->_vptr_BoundNodeVisitor[2])(this,pBVar8);
    this_02 = &pBVar9->right;
    break;
  default:
    this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Unimplemented query node in ExpressionIterator","");
    NotImplementedException::NotImplementedException(this_01,&local_50);
    __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case RECURSIVE_CTE_NODE:
    pBVar6 = BoundQueryNode::Cast<duckdb::BoundRecursiveCTENode>(node);
    pBVar8 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
             operator*(&pBVar6->left);
    (*this->_vptr_BoundNodeVisitor[2])(this,pBVar8);
    this_02 = &pBVar6->right;
    break;
  case CTE_NODE:
    pBVar7 = BoundQueryNode::Cast<duckdb::BoundCTENode>(node);
    pBVar8 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
             operator*(&pBVar7->child);
    (*this->_vptr_BoundNodeVisitor[2])(this,pBVar8);
    this_02 = &pBVar7->query;
  }
  pBVar8 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
           operator*(this_02);
  (*this->_vptr_BoundNodeVisitor[2])(this,pBVar8);
LAB_00e1134e:
  if ((node->modifiers).
      super_vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (node->modifiers).
      super_vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    this_00 = &node->modifiers;
    __n = 0;
    do {
      pvVar10 = vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_true>
                ::operator[](this_00,__n);
      pBVar11 = unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                ::operator->(pvVar10);
      RVar1 = pBVar11->type;
      if (RVar1 == LIMIT_MODIFIER) {
        pvVar10 = vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_true>
                  ::operator[](this_00,__n);
        pBVar11 = unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                  ::operator->(pvVar10);
        pBVar14 = BoundResultModifier::Cast<duckdb::BoundLimitModifier>(pBVar11);
        pvVar10 = vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_true>
                  ::operator[](this_00,__n);
        pBVar11 = unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                  ::operator->(pvVar10);
        pBVar15 = BoundResultModifier::Cast<duckdb::BoundLimitModifier>(pBVar11);
        if ((pBVar14->limit_val).expression.
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
          (*this->_vptr_BoundNodeVisitor[4])(this,&(pBVar14->limit_val).expression);
        }
        puVar17 = &(pBVar15->offset_val).expression;
        if ((puVar17->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
          (*this->_vptr_BoundNodeVisitor[4])(this,puVar17);
        }
      }
      else if (RVar1 == ORDER_MODIFIER) {
        pvVar10 = vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_true>
                  ::operator[](this_00,__n);
        pBVar11 = unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                  ::operator->(pvVar10);
        pBVar13 = BoundResultModifier::Cast<duckdb::BoundOrderModifier>(pBVar11);
        pBVar3 = (pBVar13->orders).
                 super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
                 super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pBVar20 = (pBVar13->orders).
                       super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                       .
                       super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                       ._M_impl.super__Vector_impl_data._M_start; pBVar20 != pBVar3;
            pBVar20 = pBVar20 + 1) {
          (*this->_vptr_BoundNodeVisitor[4])(this,&pBVar20->expression);
        }
      }
      else if (RVar1 == DISTINCT_MODIFIER) {
        pvVar10 = vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_true>
                  ::operator[](this_00,__n);
        pBVar11 = unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                  ::operator->(pvVar10);
        pBVar12 = BoundResultModifier::Cast<duckdb::BoundDistinctModifier>(pBVar11);
        puVar2 = (pBVar12->target_distincts).
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (puVar19 = (pBVar12->target_distincts).
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; puVar19 != puVar2;
            puVar19 = puVar19 + 1) {
          (*this->_vptr_BoundNodeVisitor[4])(this,puVar19);
        }
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)(node->modifiers).
                                 super_vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(node->modifiers).
                                 super_vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void BoundNodeVisitor::VisitBoundQueryNode(BoundQueryNode &node) {
	switch (node.type) {
	case QueryNodeType::SET_OPERATION_NODE: {
		auto &bound_setop = node.Cast<BoundSetOperationNode>();
		VisitBoundQueryNode(*bound_setop.left);
		VisitBoundQueryNode(*bound_setop.right);
		break;
	}
	case QueryNodeType::RECURSIVE_CTE_NODE: {
		auto &cte_node = node.Cast<BoundRecursiveCTENode>();
		VisitBoundQueryNode(*cte_node.left);
		VisitBoundQueryNode(*cte_node.right);
		break;
	}
	case QueryNodeType::CTE_NODE: {
		auto &cte_node = node.Cast<BoundCTENode>();
		VisitBoundQueryNode(*cte_node.child);
		VisitBoundQueryNode(*cte_node.query);
		break;
	}
	case QueryNodeType::SELECT_NODE: {
		auto &bound_select = node.Cast<BoundSelectNode>();
		for (auto &expr : bound_select.select_list) {
			VisitExpression(expr);
		}
		if (bound_select.where_clause) {
			VisitExpression(bound_select.where_clause);
		}
		for (auto &expr : bound_select.groups.group_expressions) {
			VisitExpression(expr);
		}
		if (bound_select.having) {
			VisitExpression(bound_select.having);
		}
		for (auto &expr : bound_select.aggregates) {
			VisitExpression(expr);
		}
		for (auto &entry : bound_select.unnests) {
			for (auto &expr : entry.second.expressions) {
				VisitExpression(expr);
			}
		}
		for (auto &expr : bound_select.windows) {
			VisitExpression(expr);
		}
		if (bound_select.from_table) {
			VisitBoundTableRef(*bound_select.from_table);
		}
		break;
	}
	default:
		throw NotImplementedException("Unimplemented query node in ExpressionIterator");
	}
	for (idx_t i = 0; i < node.modifiers.size(); i++) {
		switch (node.modifiers[i]->type) {
		case ResultModifierType::DISTINCT_MODIFIER:
			for (auto &expr : node.modifiers[i]->Cast<BoundDistinctModifier>().target_distincts) {
				VisitExpression(expr);
			}
			break;
		case ResultModifierType::ORDER_MODIFIER:
			for (auto &order : node.modifiers[i]->Cast<BoundOrderModifier>().orders) {
				VisitExpression(order.expression);
			}
			break;
		case ResultModifierType::LIMIT_MODIFIER: {
			auto &limit_expr = node.modifiers[i]->Cast<BoundLimitModifier>().limit_val.GetExpression();
			auto &offset_expr = node.modifiers[i]->Cast<BoundLimitModifier>().offset_val.GetExpression();
			if (limit_expr) {
				VisitExpression(limit_expr);
			}
			if (offset_expr) {
				VisitExpression(offset_expr);
			}
			break;
		}
		default:
			break;
		}
	}
}